

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O0

void on_random_number_seed(ON__UINT32 s,ON_RANDOM_NUMBER_CONTEXT *randcontext)

{
  uint local_20;
  uint local_1c;
  ON__UINT32 u;
  ON__UINT32 i;
  ON_RANDOM_NUMBER_CONTEXT *randcontext_local;
  ON__UINT32 s_local;
  
  randcontext->mt[0] = s;
  local_20 = s;
  for (local_1c = 1; local_1c < 0x270; local_1c = local_1c + 1) {
    local_20 = (local_20 ^ local_20 >> 0x1e) * 0x6c078965 + local_1c;
    randcontext->mt[local_1c] = local_20;
  }
  randcontext->mti = 0x270;
  return;
}

Assistant:

void on_random_number_seed(ON__UINT32 s,ON_RANDOM_NUMBER_CONTEXT* randcontext)
{
  ON__UINT32 i, u;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_PUSH
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 ) // warning C4127: conditional expression is constant
#endif
  if ( N*sizeof(randcontext->mt[0]) != sizeof(randcontext->mt) )
  {
    ON_ERROR("the mt[] array in struct ON_RANDOM_NUMBER_CONTEXT must have length N.");
  }
#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif

  randcontext->mt[0] = u = s & 0xffffffffUL;
  for (i=1; i<N; i++) 
  {
    u = (1812433253UL * (u ^ (u >> 30)) + i); 
    /* See Knuth TAOCP Vol2. 3rd Ed. P.106 for multiplier. */
    /* In the previous versions, MSBs of the seed affect   */
    /* only MSBs of the array mt[].                        */
    /* 2002/01/09 modified by Makoto Matsumoto             */

    u &= 0xffffffffUL;
    /* for confused people who end up with sizeof(ON__UINT32) > 4*/

    randcontext->mt[i] = u;
  }

  randcontext->mti = N;
}